

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  float fVar1;
  ImFontAtlasCustomRect *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  bool bVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    lVar8 = (long)this->CustomRectIds[0];
    if (lVar8 == -1) {
      __assert_fail("CustomRectIds[0] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                    ,0x751,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    if ((this->CustomRects).Size <= this->CustomRectIds[0]) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                    ,0x52e,
                    "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]"
                   );
    }
    pIVar2 = (this->CustomRects).Data;
    fVar9 = (float)pIVar2[lVar8].X + FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x;
    fVar10 = (float)pIVar2[lVar8].Y + FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y;
    fVar1 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1].x;
    IVar3 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar3;
    IVar4.y = (this->TexUvScale).y * fVar10;
    IVar4.x = (this->TexUvScale).x * fVar9;
    *out_uv_border = IVar4;
    fVar11 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1].y + fVar10;
    IVar5.y = (this->TexUvScale).y * fVar11;
    IVar5.x = (fVar9 + fVar1) * (this->TexUvScale).x;
    out_uv_border[1] = IVar5;
    IVar6.y = fVar10 * (this->TexUvScale).y;
    IVar6.x = (this->TexUvScale).x * (fVar9 + 109.0);
    *out_uv_fill = IVar6;
    IVar3.y = fVar11 * (this->TexUvScale).y;
    IVar3.x = (fVar9 + 109.0 + fVar1) * (this->TexUvScale).x;
    out_uv_fill[1] = IVar3;
    bVar7 = true;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}